

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O0

ssize_t __thiscall
slang::ast::ASTSerializer::write(ASTSerializer *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  JsonWriter *this_00;
  string_view in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffb8;
  
  JsonWriter::writeProperty((JsonWriter *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
  this_00 = this->writer;
  slang::ConstantValue::toString_abi_cxx11_
            ((ConstantValue *)&stack0xffffffffffffff98,(bitwidth_t)((ulong)this >> 0x20),
             SUB81((ulong)this >> 0x18,0),SUB81((ulong)this >> 0x10,0));
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  JsonWriter::writeValue(this_00,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  return extraout_RAX;
}

Assistant:

void ASTSerializer::write(std::string_view name, const ConstantValue& value) {
    writer.writeProperty(name);
    writer.writeValue(value.toString(SVInt::MAX_BITS, /* exactUnknowns */ true,
                                     /* useAssignmentPatterns */ true));
}